

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O3

int __thiscall AliHttpRequest::ParseUrl(AliHttpRequest *this)

{
  int iVar1;
  mapped_type *pmVar2;
  int iVar3;
  http_parser_url parser_url;
  http_parser_url local_60;
  key_type local_40;
  
  iVar1 = http_parser_parse_url_
                    ((this->url_)._M_dataplus._M_p,(this->url_)._M_string_length,0,&local_60);
  iVar3 = -1;
  if (iVar1 == 0) {
    if ((local_60.field_set & 8) != 0) {
      std::__cxx11::string::resize((ulong)&this->path_,(char)local_60.field_data[3].len);
      strncpy((this->path_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + local_60.field_data[3].off,
              (ulong)local_60.field_data[3].len);
    }
    if ((local_60.field_set & 1) != 0) {
      std::__cxx11::string::resize((ulong)&this->sechema_,(char)local_60.field_data[0].len);
      strncpy((this->sechema_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + local_60.field_data[0].off,
              (ulong)local_60.field_data[0].len);
    }
    if ((local_60.field_set & 2) != 0) {
      std::__cxx11::string::resize((ulong)&this->host_,(char)local_60.field_data[1].len);
      strncpy((this->host_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + local_60.field_data[1].off,
              (ulong)local_60.field_data[1].len);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Host","");
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->map_request_headers_,&local_40);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_60.field_set & 0x10) != 0) {
      std::__cxx11::string::resize((ulong)&this->query_,(char)local_60.field_data[4].len);
      strncpy((this->query_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + local_60.field_data[4].off,
              (ulong)local_60.field_data[4].len);
    }
    if ((local_60.field_set & 0x20) != 0) {
      std::__cxx11::string::resize((ulong)&this->flagment_,(char)local_60.field_data[5].len);
      strncpy((this->flagment_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + local_60.field_data[5].off,
              (ulong)local_60.field_data[5].len);
    }
    if ((local_60.field_set & 4) == 0) {
      iVar1 = std::__cxx11::string::compare((char *)&this->sechema_);
      iVar3 = 0;
      if (iVar1 == 0) {
        iVar3 = 0;
        std::__cxx11::string::_M_replace
                  ((ulong)&this->port_,0,(char *)(this->port_)._M_string_length,0x211cac);
        this->is_tls = true;
      }
    }
    else {
      iVar3 = 0;
      std::__cxx11::string::resize((ulong)&this->port_,(char)local_60.field_data[2].len);
      strncpy((this->port_)._M_dataplus._M_p,
              (this->url_)._M_dataplus._M_p + local_60.field_data[2].off,
              (ulong)local_60.field_data[2].len);
    }
  }
  return iVar3;
}

Assistant:

int AliHttpRequest::ParseUrl() {
  http_parser_url parser_url;
  if(http_parser_parse_url_(url_.c_str(), url_.size(), false, &parser_url) != 0) {
    return -1;
  }
  if(parser_url.field_set &  (1 << UF_PATH)) {
    int len = parser_url.field_data[UF_PATH].len;
    path_.resize(len);
    strncpy((char*)path_.c_str(), url_.c_str() + parser_url.field_data[UF_PATH].off, len);
  }

  if(parser_url.field_set &  (1 << UF_SCHEMA)) {
    int len = parser_url.field_data[UF_SCHEMA].len;
    sechema_.resize(len);
    strncpy((char*)sechema_.c_str(), url_.c_str() + parser_url.field_data[UF_SCHEMA].off, len);
  }

  if(parser_url.field_set & (1 << UF_HOST)) {
    int len = parser_url.field_data[UF_HOST].len;
    host_.resize(len);
    strncpy((char*)host_.c_str(), url_.c_str() + parser_url.field_data[UF_HOST].off, len);
    this->map_request_headers_["Host"] = host_;
  }

  if(parser_url.field_set & (1 << UF_QUERY)) {
    int len = parser_url.field_data[UF_QUERY].len;
    query_.resize(len);
    strncpy((char*)query_.c_str(), url_.c_str() + parser_url.field_data[UF_QUERY].off, len);
  }

  if(parser_url.field_set & (1 << UF_FRAGMENT)) {
    int len = parser_url.field_data[UF_FRAGMENT].len;
    flagment_.resize(len);
    strncpy((char*)flagment_.c_str(), url_.c_str() + parser_url.field_data[UF_FRAGMENT].off, len);
  }

  if(parser_url.field_set & (1 << UF_PORT)) {
    int len = parser_url.field_data[UF_PORT].len;
    port_.resize(len);
    strncpy((char*)port_.c_str(), url_.c_str() + parser_url.field_data[UF_PORT].off, len);
  } else if(sechema_ == "https") {
    port_ = "443";
    this->is_tls = true;
  }

  return 0;
}